

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_vector.h
# Opt level: O0

bool __thiscall spvtools::utils::BitVector::Clear(BitVector *this,uint32_t i)

{
  ulong uVar1;
  uint uVar2;
  size_type sVar3;
  reference pvVar4;
  ulong uVar5;
  BitContainer ith_bit;
  BitContainer original;
  uint32_t bit_in_element;
  uint32_t element_index;
  uint32_t i_local;
  BitVector *this_local;
  
  uVar2 = i >> 6;
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->bits_);
  if (uVar2 < sVar3) {
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->bits_,(ulong)uVar2);
    uVar1 = *pvVar4;
    uVar5 = 1L << ((byte)i & 0x3f);
    if ((uVar1 & uVar5) == 0) {
      this_local._7_1_ = false;
    }
    else {
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->bits_,(ulong)uVar2);
      *pvVar4 = uVar1 & (uVar5 ^ 0xffffffffffffffff);
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Clear(uint32_t i) {
    uint32_t element_index = i / kBitContainerSize;
    uint32_t bit_in_element = i % kBitContainerSize;

    if (element_index >= bits_.size()) {
      return false;
    }

    BitContainer original = bits_[element_index];
    BitContainer ith_bit = static_cast<BitContainer>(1) << bit_in_element;

    if ((original & ith_bit) == 0) {
      return false;
    } else {
      bits_[element_index] = original & (~ith_bit);
      return true;
    }
  }